

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

void __thiscall
google::protobuf::Reflection::UnsafeArenaSwap(Reflection *this,Message *lhs,Message *rhs)

{
  bool bVar1;
  int iVar2;
  InternalMetadata *this_00;
  InternalMetadata *other;
  FieldDescriptor *pFVar3;
  OneofDescriptor *this_01;
  uint32_t *puVar4;
  uint32_t *puVar5;
  ExtensionSet *this_02;
  ExtensionSet *other_00;
  int local_68;
  int i_3;
  int has_bits_size;
  FieldDescriptor *field_1;
  int i_2;
  int fields_with_has_bits;
  uint32 *rhs_has_bits;
  uint32 *lhs_has_bits;
  OneofDescriptor *oneof;
  int i_1;
  int oneof_decl_count;
  FieldDescriptor *field;
  int i;
  Message *rhs_local;
  Message *lhs_local;
  Reflection *this_local;
  
  if (lhs != rhs) {
    this_00 = MutableInternalMetadata(this,lhs);
    other = MutableInternalMetadata(this,rhs);
    internal::InternalMetadata::InternalSwap(this_00,other);
    for (field._4_4_ = 0; field._4_4_ <= this->last_non_weak_field_index_;
        field._4_4_ = field._4_4_ + 1) {
      pFVar3 = Descriptor::field(this->descriptor_,field._4_4_);
      bVar1 = internal::ReflectionSchema::InRealOneof(&this->schema_,pFVar3);
      if ((!bVar1) &&
         (bVar1 = internal::ReflectionSchema::IsFieldStripped(&this->schema_,pFVar3), !bVar1)) {
        UnsafeShallowSwapField(this,lhs,rhs,pFVar3);
      }
    }
    iVar2 = Descriptor::oneof_decl_count(this->descriptor_);
    for (oneof._0_4_ = 0; (int)oneof < iVar2; oneof._0_4_ = (int)oneof + 1) {
      this_01 = Descriptor::oneof_decl(this->descriptor_,(int)oneof);
      bVar1 = OneofDescriptor::is_synthetic(this_01);
      if (!bVar1) {
        SwapOneofField<true>(this,lhs,rhs,this_01);
      }
    }
    bVar1 = internal::ReflectionSchema::HasHasbits(&this->schema_);
    if (bVar1) {
      puVar4 = MutableHasBits(this,lhs);
      puVar5 = MutableHasBits(this,rhs);
      field_1._4_4_ = 0;
      for (field_1._0_4_ = 0; iVar2 = Descriptor::field_count(this->descriptor_),
          (int)field_1 < iVar2; field_1._0_4_ = (int)field_1 + 1) {
        pFVar3 = Descriptor::field(this->descriptor_,(int)field_1);
        bVar1 = FieldDescriptor::is_repeated(pFVar3);
        if ((!bVar1) &&
           (bVar1 = internal::ReflectionSchema::InRealOneof(&this->schema_,pFVar3), !bVar1)) {
          field_1._4_4_ = field_1._4_4_ + 1;
        }
      }
      for (local_68 = 0; local_68 < (field_1._4_4_ + 0x1f) / 0x20; local_68 = local_68 + 1) {
        std::swap<unsigned_int>(puVar4 + local_68,puVar5 + local_68);
      }
    }
    bVar1 = internal::ReflectionSchema::HasExtensionSet(&this->schema_);
    if (bVar1) {
      this_02 = MutableExtensionSet(this,lhs);
      other_00 = MutableExtensionSet(this,rhs);
      internal::ExtensionSet::InternalSwap(this_02,other_00);
    }
  }
  return;
}

Assistant:

void Reflection::UnsafeArenaSwap(Message* lhs, Message* rhs) const {
  if (lhs == rhs) return;

  MutableInternalMetadata(lhs)->InternalSwap(MutableInternalMetadata(rhs));

  for (int i = 0; i <= last_non_weak_field_index_; i++) {
    const FieldDescriptor* field = descriptor_->field(i);
    if (schema_.InRealOneof(field)) continue;
    if (schema_.IsFieldStripped(field)) continue;
    UnsafeShallowSwapField(lhs, rhs, field);
  }
  const int oneof_decl_count = descriptor_->oneof_decl_count();
  for (int i = 0; i < oneof_decl_count; i++) {
    const OneofDescriptor* oneof = descriptor_->oneof_decl(i);
    if (!oneof->is_synthetic()) {
      SwapOneofField<true>(lhs, rhs, oneof);
    }
  }

  // Swapping bits need to happen after swapping fields, because the latter may
  // depend on the has bit information.
  if (schema_.HasHasbits()) {
    uint32* lhs_has_bits = MutableHasBits(lhs);
    uint32* rhs_has_bits = MutableHasBits(rhs);

    int fields_with_has_bits = 0;
    for (int i = 0; i < descriptor_->field_count(); i++) {
      const FieldDescriptor* field = descriptor_->field(i);
      if (field->is_repeated() || schema_.InRealOneof(field)) {
        continue;
      }
      fields_with_has_bits++;
    }

    int has_bits_size = (fields_with_has_bits + 31) / 32;

    for (int i = 0; i < has_bits_size; i++) {
      std::swap(lhs_has_bits[i], rhs_has_bits[i]);
    }
  }

  if (schema_.HasExtensionSet()) {
    MutableExtensionSet(lhs)->InternalSwap(MutableExtensionSet(rhs));
  }
}